

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O2

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::findImpl<axl::sl::BoyerMooreTextAccessor>
          (BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
           *this,BoyerMooreTextAccessor *accessor,size_t i0,size_t length)

{
  size_t sVar1;
  ulong uVar2;
  wchar_t wVar3;
  ulong uVar4;
  size_t i;
  long lVar5;
  long lVar6;
  
  sVar1 = (this->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count;
  i = (i0 + sVar1) - 1;
  lVar6 = sVar1 - 1;
  do {
    lVar5 = lVar6;
    if (length <= i) {
      return i - lVar6;
    }
    while (wVar3 = BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>::
                   operator[](&accessor->
                               super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                              ,i),
          wVar3 == (this->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p
                   [lVar5]) {
      if (lVar5 == 0) {
        return i;
      }
      i = i - 1;
      lVar5 = lVar5 + -1;
    }
    uVar2 = (this->m_skipTables).m_badSkipTable.super_BoyerMooreSkipTableRoot.m_table.
            super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p
            [(ulong)(long)wVar3 %
             (this->m_skipTables).m_badSkipTable.super_BoyerMooreSkipTableRoot.m_table.
             super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count];
    uVar4 = (this->m_skipTables).m_goodSkipTable.super_BoyerMooreSkipTableRoot.m_table.
            super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p[lVar5];
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    i = i + uVar4;
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}